

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void STAT_Serialize(FSerializer *arc)

{
  bool bVar1;
  uint amount;
  uint uVar2;
  int iVar3;
  FEpisode *pFVar4;
  uint local_30;
  uint j;
  int i;
  FString startlevel;
  FSerializer *arc_local;
  
  startlevel.Chars = (char *)arc;
  FString::FString((FString *)&stack0xffffffffffffffe8);
  amount = TArray<OneLevel,_OneLevel>::Size(&LevelData);
  bVar1 = FSerializer::BeginObject((FSerializer *)startlevel.Chars,"statistics");
  if (bVar1) {
    bVar1 = FSerializer::isReading((FSerializer *)startlevel.Chars);
    if (bVar1) {
      FSerializer::operator()
                ((FSerializer *)startlevel.Chars,"startlevel",(FString *)&stack0xffffffffffffffe8);
      StartEpisode = (FEpisode *)0x0;
      for (local_30 = 0; uVar2 = TArray<FEpisode,_FEpisode>::Size(&AllEpisodes), local_30 < uVar2;
          local_30 = local_30 + 1) {
        pFVar4 = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(ulong)local_30);
        iVar3 = FString::CompareNoCase(&pFVar4->mEpisodeMap,(FString *)&stack0xffffffffffffffe8);
        if (iVar3 == 0) {
          StartEpisode = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(ulong)local_30);
          break;
        }
      }
      TArray<OneLevel,_OneLevel>::Resize(&LevelData,amount);
    }
    else {
      if (StartEpisode != (FEpisode *)0x0) {
        FString::operator=((FString *)&stack0xffffffffffffffe8,&StartEpisode->mEpisodeMap);
      }
      FSerializer::operator()
                ((FSerializer *)startlevel.Chars,"startlevel",(FString *)&stack0xffffffffffffffe8);
    }
    FSerializer::operator()((FSerializer *)startlevel.Chars,"levels",&LevelData);
    FSerializer::EndObject((FSerializer *)startlevel.Chars);
  }
  FString::~FString((FString *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void STAT_Serialize(FSerializer &arc)
{
	FString startlevel;
	int i = LevelData.Size();

	if (arc.BeginObject("statistics"))
	{
		if (arc.isReading())
		{
			arc("startlevel", startlevel);
			StartEpisode = NULL;
			for (unsigned int j = 0; j < AllEpisodes.Size(); j++)
			{
				if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(startlevel))
				{
					StartEpisode = &AllEpisodes[j];
					break;
				}
			}
			LevelData.Resize(i);
		}
		else
		{
			if (StartEpisode != NULL) startlevel = StartEpisode->mEpisodeMap;
			arc("startlevel", startlevel);
		}
		arc("levels", LevelData);
		arc.EndObject();
	}
}